

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O1

string * __thiscall
cmNinjaTargetGenerator::GetTargetDependInfoPath
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,string *lang,string *config)

{
  pointer pcVar1;
  size_type sVar2;
  string *psVar3;
  cmGlobalNinjaGenerator *pcVar4;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  long *local_140;
  undefined8 local_138;
  long local_130 [2];
  long *local_120;
  undefined8 local_118;
  long local_110 [2];
  undefined8 local_100;
  undefined1 *puStack_f8;
  undefined1 local_f0 [32];
  undefined8 local_d0;
  undefined1 *local_c8;
  undefined1 local_c0 [32];
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  undefined8 local_90;
  undefined1 *puStack_88;
  undefined8 local_80;
  long *local_78;
  undefined8 local_70;
  long *local_68;
  undefined8 local_60;
  undefined1 *local_58;
  size_type local_50;
  pointer local_48;
  undefined8 local_40;
  char *local_38;
  
  psVar3 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).Makefile);
  pcVar1 = (psVar3->_M_dataplus)._M_p;
  sVar2 = psVar3->_M_string_length;
  puStack_f8 = local_f0;
  local_100 = 1;
  local_f0[0] = 0x2f;
  (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
    _vptr_cmLocalGenerator[0xe])
            (&local_120,this->LocalGenerator,(this->super_cmCommonTargetGenerator).GeneratorTarget);
  pcVar4 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
  (*(pcVar4->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x49])
            (&local_140,pcVar4,config);
  local_90 = local_100;
  puStack_88 = puStack_f8;
  local_80 = local_118;
  local_78 = local_120;
  local_70 = local_138;
  local_68 = local_140;
  local_c8 = local_c0;
  local_d0 = 1;
  local_c0[0] = 0x2f;
  local_60 = 1;
  local_48 = (lang->_M_dataplus)._M_p;
  local_50 = lang->_M_string_length;
  local_40 = 0xf;
  local_38 = "DependInfo.json";
  views._M_len = 7;
  views._M_array = &local_a0;
  local_a0._M_len = sVar2;
  local_a0._M_str = pcVar1;
  local_58 = local_c8;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  if (local_140 != local_130) {
    operator_delete(local_140,local_130[0] + 1);
  }
  if (local_120 != local_110) {
    operator_delete(local_120,local_110[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaTargetGenerator::GetTargetDependInfoPath(
  std::string const& lang, const std::string& config) const
{
  std::string path =
    cmStrCat(this->Makefile->GetCurrentBinaryDirectory(), '/',
             this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget),
             this->GetGlobalGenerator()->ConfigDirectory(config), '/', lang,
             "DependInfo.json");
  return path;
}